

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O0

void __thiscall QComboBoxPrivate::updateLineEditGeometry(QComboBoxPrivate *this)

{
  uint uVar1;
  AlignmentFlag flags;
  QComboBox *pQVar2;
  QStyle *pQVar3;
  QSize QVar4;
  QComboBoxPrivate *in_RDI;
  long in_FS_OFFSET;
  bool bVar5;
  QRect QVar6;
  QComboBox *q;
  QRect comboRect;
  QRect editRect;
  QStyleOptionComboBox opt;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  LayoutDirection in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  undefined7 in_stack_fffffffffffffef0;
  byte bVar7;
  undefined4 in_stack_ffffffffffffff18;
  Representation in_stack_ffffffffffffff1c;
  QFlagsStorage<Qt::AlignmentFlag> alignment;
  QIcon local_b0;
  undefined1 local_a8 [12];
  Representation RStack_9c;
  undefined1 local_98 [144];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI->lineEdit != (QLineEdit *)0x0) {
    pQVar2 = q_func(in_RDI);
    memset(local_98,0xaa,0x90);
    QStyleOptionComboBox::QStyleOptionComboBox((QStyleOptionComboBox *)0x530d5d);
    (**(code **)(*(long *)&pQVar2->super_QWidget + 0x1b8))(pQVar2,local_98);
    local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    stack0xffffffffffffff60 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar3 = QWidget::style((QWidget *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8)
                           );
    _local_a8 = (QRect)(**(code **)(*(long *)pQVar3 + 0xd8))(pQVar3,1,local_98,2,pQVar2);
    uVar1 = QPersistentModelIndex::isValid();
    bVar5 = (uVar1 & 1) != 0;
    bVar7 = 0;
    if (bVar5) {
      QComboBox::currentIndex
                ((QComboBox *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
      QComboBox::itemIcon((QComboBox *)
                          CONCAT44(in_stack_ffffffffffffff1c.m_i,in_stack_ffffffffffffff18),
                          (int)((ulong)in_RDI >> 0x20));
      bVar7 = QIcon::isNull();
      bVar7 = bVar7 ^ 0xff;
    }
    uVar1 = CONCAT13(bVar7,(int3)in_stack_fffffffffffffee4);
    if (bVar5) {
      QIcon::~QIcon(&local_b0);
    }
    if ((uVar1 & 0x1000000) != 0) {
      alignment.i = RStack_9c.m_i;
      flags = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      QComboBox::iconSize((QComboBox *)CONCAT17(bVar7,in_stack_fffffffffffffef0));
      QSize::width((QSize *)0x530eb1);
      QRect::setWidth((QRect *)CONCAT44(uVar1,in_stack_fffffffffffffee0),flags);
      in_stack_fffffffffffffee0 = QWidget::layoutDirection((QWidget *)0x530ed1);
      QFlags<Qt::AlignmentFlag>::QFlags
                ((QFlags<Qt::AlignmentFlag> *)CONCAT44(uVar1,in_stack_fffffffffffffee0),flags);
      QVar4 = QRect::size((QRect *)CONCAT17(bVar7,in_stack_fffffffffffffef0));
      in_stack_ffffffffffffff1c = QVar4.wd.m_i;
      QVar6 = QStyle::alignedRect(QVar4.ht.m_i.m_i,(Alignment)alignment.i,
                                  (QSize *)CONCAT44(in_stack_ffffffffffffff1c.m_i,
                                                    in_stack_ffffffffffffff18),(QRect *)in_RDI);
      _local_a8 = QVar6;
    }
    QWidget::setGeometry
              ((QWidget *)CONCAT44(in_stack_ffffffffffffff1c.m_i,in_stack_ffffffffffffff18),
               (QRect *)in_RDI);
    QStyleOptionComboBox::~QStyleOptionComboBox
              ((QStyleOptionComboBox *)CONCAT44(uVar1,in_stack_fffffffffffffee0));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QComboBoxPrivate::updateLineEditGeometry()
{
    if (!lineEdit)
        return;

    Q_Q(QComboBox);
    QStyleOptionComboBox opt;
    q->initStyleOption(&opt);
    QRect editRect = q->style()->subControlRect(QStyle::CC_ComboBox, &opt,
                                                QStyle::SC_ComboBoxEditField, q);
    if (currentIndex.isValid() && !q->itemIcon(q->currentIndex()).isNull()) {
        QRect comboRect(editRect);
        editRect.setWidth(editRect.width() - q->iconSize().width() - 4);
        editRect = QStyle::alignedRect(q->layoutDirection(), Qt::AlignRight,
                                       editRect.size(), comboRect);
    }
    lineEdit->setGeometry(editRect);
}